

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void aom_highbd_v_predictor_32x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  bool bVar9;
  
  iVar8 = 0x20;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    uVar1 = *(undefined8 *)above;
    uVar2 = *(undefined8 *)(above + 4);
    uVar3 = *(undefined8 *)(above + 8);
    uVar4 = *(undefined8 *)(above + 0xc);
    uVar5 = *(undefined8 *)(above + 0x10);
    uVar6 = *(undefined8 *)(above + 0x14);
    uVar7 = *(undefined8 *)(above + 0x1c);
    *(undefined8 *)(dst + 0x18) = *(undefined8 *)(above + 0x18);
    *(undefined8 *)(dst + 0x1c) = uVar7;
    *(undefined8 *)(dst + 0x10) = uVar5;
    *(undefined8 *)(dst + 0x14) = uVar6;
    *(undefined8 *)(dst + 8) = uVar3;
    *(undefined8 *)(dst + 0xc) = uVar4;
    *(undefined8 *)dst = uVar1;
    *(undefined8 *)(dst + 4) = uVar2;
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_v_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)left;
  (void)bd;
  for (r = 0; r < bh; r++) {
    memcpy(dst, above, bw * sizeof(uint16_t));
    dst += stride;
  }
}